

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Round::applyPoint
          (Interval *__return_storage_ptr__,Round *this,EvalContext *param_1,double x)

{
  double x_00;
  ulong extraout_XMM0_Qb;
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double truncated;
  double local_50;
  double local_48;
  Interval local_30;
  double local_18;
  ulong uStack_10;
  
  local_50 = 0.0;
  local_48 = modf(x,&local_50);
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar3 = ABS(local_48);
  x_00 = local_48;
  if (dVar3 <= 0.5) {
    local_30.m_hasNaN = NAN(local_50);
    if (local_30.m_hasNaN) {
      uVar1 = 0;
      uVar2 = 0x7ff00000;
      local_30.m_hi = -INFINITY;
    }
    else {
      uVar1 = SUB84(local_50,0);
      uVar2 = (undefined4)((ulong)local_50 >> 0x20);
      local_30.m_hi = local_50;
    }
    local_30.m_lo = (double)CONCAT44(uVar2,uVar1);
    local_18 = dVar3;
    uStack_10 = extraout_XMM0_Qb & 0x7fffffffffffffff;
    tcu::Interval::operator|=(__return_storage_ptr__,&local_30);
    x_00 = local_48;
    dVar3 = local_18;
  }
  if (0.5 <= dVar3) {
    local_48 = local_50;
    local_30.m_hi = deSign(x_00);
    local_30.m_hi = local_30.m_hi + local_48;
    local_30.m_hasNaN = NAN(local_30.m_hi);
    local_30.m_lo = local_30.m_hi;
    if (local_30.m_hasNaN) {
      local_30.m_hi = -INFINITY;
      local_30.m_lo = INFINITY;
    }
    tcu::Interval::operator|=(__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint	(const EvalContext&, double x) const
	{
		double			truncated	= 0.0;
		const double	fract		= deModf(x, &truncated);
		Interval		ret;

		if (fabs(fract) <= 0.5)
			ret |= truncated;
		if (fabs(fract) >= 0.5)
			ret |= truncated + deSign(fract);

		return ret;
	}